

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterFwd.hpp
# Opt level: O0

string * __thiscall
CLI::Formatter::make_option_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,Option *opt,bool is_positional)

{
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream local_1b0 [8];
  stringstream out;
  ostream local_1a0 [383];
  byte local_21;
  Option *pOStack_20;
  bool is_positional_local;
  Option *opt_local;
  Formatter *this_local;
  
  local_21 = is_positional;
  pOStack_20 = opt;
  opt_local = (Option *)this;
  this_local = (Formatter *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xc])
            (&local_1f0,this,pOStack_20,(ulong)(local_21 & 1));
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xd])(&local_220,this,pOStack_20);
  ::std::operator+(&local_1d0,&local_1f0,&local_220);
  (*(this->super_FormatterBase)._vptr_FormatterBase[0xe])(&local_240,this,pOStack_20);
  detail::format_help(local_1a0,&local_1d0,&local_240,(this->super_FormatterBase).column_width_);
  ::std::__cxx11::string::~string((string *)&local_240);
  ::std::__cxx11::string::~string((string *)&local_1d0);
  ::std::__cxx11::string::~string((string *)&local_220);
  ::std::__cxx11::string::~string((string *)&local_1f0);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string make_option(const Option *opt, bool is_positional) const {
        std::stringstream out;
        detail::format_help(
            out, make_option_name(opt, is_positional) + make_option_opts(opt), make_option_desc(opt), column_width_);
        return out.str();
    }